

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O3

uint32_t __thiscall cppnet::BufferQueue::FindStr(BufferQueue *this,char *s,uint32_t s_len)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  uint32_t uVar5;
  
  if ((this->_buffer_list)._size == 0) {
    uVar5 = 0;
  }
  else {
    peVar1 = (this->_buffer_list)._head.
             super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->_buffer_list)._head.
              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    uVar5 = 0;
    while (peVar1 != (element_type *)0x0) {
      iVar4 = (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[9])(peVar1,s,(ulong)s_len);
      if (iVar4 != 0) {
        uVar5 = uVar5 + iVar4;
        break;
      }
      if (peVar1 == (this->_buffer_write).
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      break;
      iVar4 = (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[8])(peVar1);
      peVar2 = (peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = (peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      uVar5 = uVar5 + iVar4;
      peVar1 = peVar2;
      this_00 = p_Var3;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return uVar5;
}

Assistant:

uint32_t BufferQueue::FindStr(const char* s, uint32_t s_len) {
    if (_buffer_list.Size() == 0) {
        return 0;
    }

    std::shared_ptr<BufferBlock> temp = _buffer_list.GetHead();
    uint32_t cur_len = 0;
    uint32_t can_read = 0;
    while (temp) {
        can_read = temp->FindStr(s, s_len);
        if (can_read > 0) {
            cur_len += can_read;
            break;
        }
        if (temp == _buffer_write) {
            break;
        }
        cur_len += temp->GetCanReadLength();
        temp = temp->GetNext();
    }
    return cur_len;
}